

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManSwapPos(Gia_Man_t *p,int i)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  if (-1 < i) {
    uVar1 = p->vCos->nSize;
    if (i < (int)(uVar1 - p->nRegs)) {
      if (i == 0) {
        return;
      }
      if ((int)uVar1 < 1) {
LAB_00243d85:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      puVar3 = (uint *)p->vCos->pArray;
      uVar2 = *puVar3;
      lVar7 = (long)(int)uVar2;
      if ((lVar7 < 0) || (p->nObjs <= (int)uVar2)) {
LAB_00243d47:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      uVar5 = (uint)*(ulong *)(pGVar4 + lVar7);
      uVar6 = uVar2 - (uVar5 & 0x1fffffff);
      if (-1 < (int)uVar6) {
        if (uVar1 <= (uint)i) goto LAB_00243d85;
        uVar1 = puVar3[(uint)i];
        if (((long)(int)uVar1 < 0) || ((uint)p->nObjs <= uVar1)) goto LAB_00243d47;
        uVar8 = uVar1 - (*(uint *)(pGVar4 + (int)uVar1) & 0x1fffffff);
        if (-1 < (int)uVar8) {
          if (uVar8 < uVar2) {
            *(ulong *)(pGVar4 + lVar7) =
                 (ulong)(*(uint *)(pGVar4 + (int)uVar1) & 0x20000000 | uVar2 - uVar8 & 0x1fffffff) |
                 *(ulong *)(pGVar4 + lVar7) & 0xffffffffc0000000;
            if (p->vCos->nSize <= i) goto LAB_00243d85;
            uVar1 = p->vCos->pArray[(uint)i];
            lVar7 = (long)(int)uVar1;
            if ((lVar7 < 0) || (p->nObjs <= (int)uVar1)) goto LAB_00243d47;
            if (uVar6 < uVar1) {
              *(ulong *)(p->pObjs + lVar7) =
                   (ulong)(uVar5 & 0x20000000 | uVar1 - uVar6 & 0x1fffffff) |
                   *(ulong *)(p->pObjs + lVar7) & 0xffffffffc0000000;
              return;
            }
          }
          __assert_fail("Gia_ObjId(p, pObjCo) > Abc_Lit2Var(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x36e,"void Gia_ManPatchCoDriver(Gia_Man_t *, int, int)");
        }
      }
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
  }
  __assert_fail("i >= 0 && i < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x694,"void Gia_ManSwapPos(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManSwapPos( Gia_Man_t * p, int i )
{
    int Lit0, LitI;
    assert( i >= 0 && i < Gia_ManPoNum(p) );
    if ( i == 0 )
        return;
    Lit0 = Gia_ObjFaninLit0p( p, Gia_ManPo(p, 0) );
    LitI = Gia_ObjFaninLit0p( p, Gia_ManPo(p, i) );
    Gia_ManPatchCoDriver( p, 0, LitI );
    Gia_ManPatchCoDriver( p, i, Lit0 );
}